

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O3

QDomAttrPrivate * __thiscall
QDomElementPrivate::setAttributeNode(QDomElementPrivate *this,QDomAttrPrivate *newAttr)

{
  undefined1 *puVar1;
  QDomNamedNodeMapPrivate *pQVar2;
  QDomNodePrivate *pQVar3;
  long in_FS_OFFSET;
  QString local_60;
  const_iterator local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newAttr == (QDomAttrPrivate *)0x0) {
    pQVar3 = (QDomNodePrivate *)0x0;
  }
  else {
    pQVar2 = this->m_attr;
    local_60.d.d = (newAttr->super_QDomNodePrivate).name.d.d;
    local_60.d.ptr = (newAttr->super_QDomNodePrivate).name.d.ptr;
    local_60.d.size = (newAttr->super_QDomNodePrivate).name.d.size;
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_60.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    local_48.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)
                   &DAT_aaaaaaaaaaaaaaaa;
    local_48.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QMultiHash<QString,_QDomNodePrivate_*>::constFindImpl<QString>(&local_48,&pQVar2->map,&local_60)
    ;
    if (local_48.e == (Chain **)0x0) {
      pQVar3 = (QDomNodePrivate *)0x0;
    }
    else {
      pQVar3 = (*local_48.e)->value;
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQVar3 != (QDomNodePrivate *)0x0) {
      pQVar2 = this->m_attr;
      local_48.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)
                     (newAttr->super_QDomNodePrivate).name.d.d;
      local_48.i.bucket = (size_t)(newAttr->super_QDomNodePrivate).name.d.ptr;
      local_48.e = (Chain **)(newAttr->super_QDomNodePrivate).name.d.size;
      if (local_48.i.d != (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)0x0) {
        LOCK();
        (((QArrayData *)&(local_48.i.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i =
             (((QArrayData *)&(local_48.i.d)->ref)->ref_)._q_value.super___atomic_base<int>._M_i + 1
        ;
        UNLOCK();
      }
      QDomNamedNodeMapPrivate::removeNamedItem(pQVar2,(QString *)&local_48);
      if (local_48.i.d != (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)0x0) {
        LOCK();
        ((local_48.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((local_48.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_48.i.d,2,0x10);
        }
      }
    }
    QDomNamedNodeMapPrivate::setNamedItem(this->m_attr,&newAttr->super_QDomNodePrivate);
    (newAttr->super_QDomNodePrivate).ownerNode = &this->super_QDomNodePrivate;
    puVar1 = &(newAttr->super_QDomNodePrivate).field_0x98;
    *puVar1 = *puVar1 | 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDomAttrPrivate *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QDomAttrPrivate* QDomElementPrivate::setAttributeNode(QDomAttrPrivate* newAttr)
{
    if (!newAttr)
        return nullptr;

    QDomNodePrivate* foundAttr = m_attr->namedItem(newAttr->nodeName());
    if (foundAttr)
        m_attr->removeNamedItem(newAttr->nodeName());

    // Referencing is done by the maps
    m_attr->setNamedItem(newAttr);
    newAttr->setParent(this);

    return static_cast<QDomAttrPrivate *>(foundAttr);
}